

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvector_serial.c
# Opt level: O0

int VScaleDiffVectorArray_Serial(int nvec,realtype c,N_Vector *X,N_Vector *Y,N_Vector *Z)

{
  int iVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  realtype *zd;
  realtype *yd;
  realtype *xd;
  sunindextype N;
  sunindextype j;
  int i;
  N_Vector *Z_local;
  N_Vector *Y_local;
  N_Vector *X_local;
  realtype c_local;
  int nvec_local;
  
  iVar1 = *(*X)->content;
  for (i = 0; i < nvec; i = i + 1) {
    lVar2 = *(long *)((long)X[i]->content + 8);
    lVar3 = *(long *)((long)Y[i]->content + 8);
    lVar4 = *(long *)((long)Z[i]->content + 8);
    for (j = 0; j < iVar1; j = j + 1) {
      *(double *)(lVar4 + (long)j * 8) =
           c * (*(double *)(lVar2 + (long)j * 8) - *(double *)(lVar3 + (long)j * 8));
    }
  }
  return 0;
}

Assistant:

static int VScaleDiffVectorArray_Serial(int nvec, realtype c, N_Vector* X, N_Vector* Y, N_Vector* Z)
{
  int          i;
  sunindextype j, N;
  realtype*    xd=NULL;
  realtype*    yd=NULL;
  realtype*    zd=NULL;

  N = NV_LENGTH_S(X[0]);

  for (i=0; i<nvec; i++) {
    xd = NV_DATA_S(X[i]);
    yd = NV_DATA_S(Y[i]);
    zd = NV_DATA_S(Z[i]);
    for (j=0; j<N; j++)
      zd[j] = c * (xd[j] - yd[j]);
  }

  return(0);
}